

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QSharedDataPointer<QPropertyBindingErrorPrivate>::~QSharedDataPointer
          (QSharedDataPointer<QPropertyBindingErrorPrivate> *this)

{
  QPropertyBindingErrorPrivate *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QPropertyBindingErrorPrivate *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type_conflict)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      pQVar1 = (this->d).ptr;
      if (pQVar1 != (QPropertyBindingErrorPrivate *)0x0) {
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&(pQVar1->description).d);
      }
      operator_delete(pQVar1,0x20);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }